

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_matrix.cpp
# Opt level: O3

int __thiscall ON_Matrix::RowReduce(ON_Matrix *this,double zero_tolerance,double *B,double *pivot)

{
  ulong uVar1;
  double **ppdVar2;
  ulong uVar3;
  double ***pppdVar4;
  double *pdVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double local_80;
  
  uVar9 = this->m_row_count;
  uVar3 = (ulong)uVar9;
  pppdVar4 = &this->m;
  if (uVar9 == (this->m_rowmem).m_count) {
    pppdVar4 = &(this->m_rowmem).m_a;
  }
  uVar11 = this->m_col_count;
  if ((int)uVar9 < this->m_col_count) {
    uVar11 = uVar9;
  }
  if ((int)uVar11 < 1) {
    dVar14 = 0.0;
    iVar8 = 0;
  }
  else {
    ppdVar2 = *pppdVar4;
    local_80 = 0.0;
    uVar10 = 1;
    uVar6 = 0;
    do {
      pdVar5 = ppdVar2[uVar6];
      dVar13 = pdVar5[uVar6];
      dVar15 = ABS(dVar13);
      uVar1 = uVar6 + 1;
      if ((long)uVar1 < (long)(int)uVar3) {
        uVar12 = uVar6 & 0xffffffff;
        uVar7 = uVar10;
        do {
          if (dVar15 < ABS(ppdVar2[uVar7][uVar6])) {
            uVar12 = uVar7 & 0xffffffff;
            dVar15 = ABS(ppdVar2[uVar7][uVar6]);
          }
          uVar7 = uVar7 + 1;
        } while ((uVar3 & 0xffffffff) != uVar7);
      }
      else {
        uVar12 = uVar6 & 0xffffffff;
      }
      dVar14 = dVar15;
      if ((uVar6 != 0) && (local_80 <= dVar15)) {
        dVar14 = local_80;
      }
      if (dVar15 <= zero_tolerance) goto LAB_004f22e0;
      iVar8 = (int)uVar12;
      if (uVar6 != uVar12) {
        SwapRows(this,iVar8,(uint)uVar6);
        dVar13 = B[iVar8];
        B[iVar8] = B[uVar6];
        B[uVar6] = dVar13;
        pdVar5 = ppdVar2[uVar6];
        dVar13 = pdVar5[uVar6];
      }
      pdVar5[uVar6] = 1.0;
      uVar9 = ~(uint)uVar6;
      ON_ArrayScale(this->m_col_count + uVar9,1.0 / dVar13,pdVar5 + uVar1,pdVar5 + uVar1);
      B[uVar6] = (1.0 / dVar13) * B[uVar6];
      uVar3 = (ulong)this->m_row_count;
      uVar12 = uVar10;
      if ((long)uVar1 < (long)uVar3) {
        do {
          pdVar5 = ppdVar2[uVar12];
          dVar13 = pdVar5[uVar6];
          pdVar5[uVar6] = 0.0;
          if (zero_tolerance < ABS(dVar13)) {
            ON_Array_aA_plus_B(this->m_col_count + uVar9,-dVar13,ppdVar2[uVar6] + uVar1,
                               pdVar5 + uVar1,pdVar5 + uVar1);
            B[uVar12] = B[uVar12] - dVar13 * B[uVar6];
            uVar3 = (ulong)(uint)this->m_row_count;
          }
          uVar12 = uVar12 + 1;
        } while ((int)uVar12 < (int)uVar3);
      }
      uVar10 = uVar10 + 1;
      uVar6 = uVar1;
      local_80 = dVar14;
    } while (uVar1 != uVar11);
    uVar6 = (ulong)uVar11;
LAB_004f22e0:
    iVar8 = (int)uVar6;
  }
  if (pivot != (double *)0x0) {
    *pivot = dVar14;
  }
  return iVar8;
}

Assistant:

int
ON_Matrix::RowReduce( 
    double zero_tolerance,
    double* B,
    double* pivot 
    )
{
  double t;
  double x, piv;
  int i, k, ix, rank;

  double** this_m = ThisM();
  piv = 0.0;
  rank = 0;
  const int n = m_row_count <= m_col_count ? m_row_count : m_col_count;
  for ( k = 0; k < n; k++ ) {
    ix = k;
    x = fabs(this_m[ix][k]);
    for ( i = k+1; i < m_row_count; i++ ) {
      if ( fabs(this_m[i][k]) > x ) {
        ix = i;
        x = fabs(this_m[ix][k]);
      }
    }
    if ( x < piv || k == 0 ) {
      piv = x;
    }
    if ( x <= zero_tolerance )
      break;
    rank++;

    if ( ix != k )
    {
      // swap rows of matrix and B
      SwapRows( ix, k );
      t = B[ix]; B[ix] = B[k]; B[k] = t;
    }

    // scale row k of matrix and B
    x = 1.0/this_m[k][k];
    this_m[k][k] = 1.0;
    ON_ArrayScale( m_col_count - 1 - k, x, &this_m[k][k+1], &this_m[k][k+1] );
    B[k] *= x;

    // zero column k for rows below this_m[k][k]
    for ( i = k+1; i < m_row_count; i++ ) {
      x = -this_m[i][k];
      this_m[i][k] = 0.0;
      if ( fabs(x) > zero_tolerance ) {
        ON_Array_aA_plus_B( m_col_count - 1 - k, x, &this_m[k][k+1], &this_m[i][k+1], &this_m[i][k+1] );
        B[i] += x*B[k];
      }
    }
  }

  if ( pivot )
    *pivot = piv;

  return rank;
}